

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O1

int xmlParse3986Fragment(xmlURIPtr uri,char **str)

{
  byte bVar1;
  xmlChar *pxVar2;
  int len;
  uint uVar3;
  byte *pbVar4;
  
  if (str == (char **)0x0) {
    return -1;
  }
  pbVar4 = (byte *)*str;
  do {
    bVar1 = *pbVar4;
    if ((9 < (byte)(bVar1 - 0x30)) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) {
      uVar3 = bVar1 - 0x21;
      if (uVar3 < 0x3f) {
        if ((0x54000000d6007fe9U >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
          if ((ulong)uVar3 != 4) goto LAB_0018da9d;
          if ((((byte)(pbVar4[1] - 0x30) < 10) ||
              ((uVar3 = pbVar4[1] - 0x41, uVar3 < 0x26 &&
               ((0x3f0000003fU >> ((ulong)uVar3 & 0x3f) & 1) != 0)))) &&
             (((byte)(pbVar4[2] - 0x30) < 10 ||
              ((uVar3 = pbVar4[2] - 0x41, uVar3 < 0x26 &&
               ((0x3f0000003fU >> ((ulong)uVar3 & 0x3f) & 1) != 0)))))) goto LAB_0018da32;
          goto LAB_0018daa2;
        }
      }
      else {
LAB_0018da9d:
        if (bVar1 != 0x7e) {
LAB_0018daa2:
          if (uri == (xmlURIPtr)0x0) goto LAB_0018dafb;
          if ((((uri->cleanup & 1) == 0) || (0x21 < bVar1 - 0x5c)) ||
             ((0x380000015U >> ((ulong)(bVar1 - 0x5c) & 0x3f) & 1) == 0)) {
            if (uri->fragment != (char *)0x0) {
              (*xmlFree)(uri->fragment);
            }
            pxVar2 = (xmlChar *)*str;
            len = (int)pbVar4 - (int)pxVar2;
            if ((uri->cleanup & 2) == 0) {
              pxVar2 = (xmlChar *)xmlURIUnescapeString((char *)pxVar2,len,(char *)0x0);
            }
            else {
              pxVar2 = xmlStrndup(pxVar2,len);
            }
            uri->fragment = (char *)pxVar2;
LAB_0018dafb:
            *str = (char *)pbVar4;
            return 0;
          }
        }
      }
    }
LAB_0018da32:
    pbVar4 = pbVar4 + (ulong)(bVar1 == 0x25) * 2 + 1;
  } while( true );
}

Assistant:

static int
xmlParse3986Fragment(xmlURIPtr uri, const char **str)
{
    const char *cur;

    if (str == NULL)
        return (-1);

    cur = *str;

    while ((ISA_PCHAR(cur)) || (*cur == '/') || (*cur == '?') ||
           (*cur == '[') || (*cur == ']') ||
           ((uri != NULL) && (uri->cleanup & 1) && (IS_UNWISE(cur))))
        NEXT(cur);
    if (uri != NULL) {
        if (uri->fragment != NULL)
            xmlFree(uri->fragment);
	if (uri->cleanup & 2)
	    uri->fragment = STRNDUP(*str, cur - *str);
	else
	    uri->fragment = xmlURIUnescapeString(*str, cur - *str, NULL);
    }
    *str = cur;
    return (0);
}